

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O2

FT_Error cff_size_request(FT_Size size,FT_Size_Request req)

{
  long c_;
  long b_;
  CFF_Size pCVar1;
  int iVar2;
  FT_Long a_;
  FT_Fixed FVar3;
  ulong uVar4;
  FT_Face face;
  ulong uVar5;
  long lVar6;
  FT_ULong local_68;
  FT_ULong strike_index;
  long local_58;
  ulong local_50;
  long local_48;
  PSH_Globals_Funcs local_40;
  CFF_Size local_38;
  
  face = size->face;
  local_38 = (CFF_Size)size;
  if ((face->face_flags & 2) != 0) {
    iVar2 = (**(code **)(*(long *)&face[3].units_per_EM + 0xd0))(face,req,&local_68);
    if (iVar2 == 0) {
      cff_size_select(&local_38->root,local_68);
      return 0;
    }
    local_38->strike_index = 0xffffffff;
    face = (local_38->root).face;
  }
  pCVar1 = local_38;
  FT_Request_Metrics(face,req);
  local_40 = cff_size_get_globals_funcs(pCVar1);
  if (local_40 != (PSH_Globals_Funcs)0x0) {
    lVar6 = (local_38->root).face[4].bbox.yMin;
    strike_index = (FT_ULong)((local_38->root).internal)->module_data;
    local_58 = *(long *)(lVar6 + 0x6d0);
    (*local_40->set_scale)
              (*(PSH_Globals *)strike_index,(local_38->root).metrics.x_scale,
               (local_38->root).metrics.y_scale,0,0);
    b_ = local_58;
    uVar5 = (ulong)*(uint *)(lVar6 + 0xb30);
    local_48 = lVar6;
    while (pCVar1 = local_38, uVar5 != 0) {
      c_ = *(long *)(*(long *)(lVar6 + 0xb38 + (uVar5 - 1) * 8) + 0x68);
      a_ = (local_38->root).metrics.x_scale;
      if (b_ == c_) {
        FVar3 = (local_38->root).metrics.y_scale;
        uVar4 = uVar5;
      }
      else {
        local_50 = uVar5;
        a_ = FT_MulDiv(a_,b_,c_);
        lVar6 = local_48;
        FVar3 = FT_MulDiv((pCVar1->root).metrics.y_scale,b_,c_);
        uVar4 = local_50;
      }
      (*local_40->set_scale)(*(PSH_Globals *)(strike_index + uVar4 * 8),a_,FVar3,0,0);
      uVar5 = uVar5 - 1;
    }
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_size_request( FT_Size          size,
                    FT_Size_Request  req )
  {
    CFF_Size           cffsize = (CFF_Size)size;
    PSH_Globals_Funcs  funcs;


#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

    if ( FT_HAS_FIXED_SIZES( size->face ) )
    {
      CFF_Face      cffface = (CFF_Face)size->face;
      SFNT_Service  sfnt    = (SFNT_Service)cffface->sfnt;
      FT_ULong      strike_index;


      if ( sfnt->set_sbit_strike( cffface, req, &strike_index ) )
        cffsize->strike_index = 0xFFFFFFFFUL;
      else
        return cff_size_select( size, strike_index );
    }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

    FT_Request_Metrics( size->face, req );

    funcs = cff_size_get_globals_funcs( cffsize );

    if ( funcs )
    {
      CFF_Face      cffface  = (CFF_Face)size->face;
      CFF_Font      font     = (CFF_Font)cffface->extra.data;
      CFF_Internal  internal = (CFF_Internal)size->internal->module_data;

      FT_Long  top_upm  = (FT_Long)font->top_font.font_dict.units_per_em;
      FT_UInt  i;


      funcs->set_scale( internal->topfont,
                        size->metrics.x_scale, size->metrics.y_scale,
                        0, 0 );

      for ( i = font->num_subfonts; i > 0; i-- )
      {
        CFF_SubFont  sub     = font->subfonts[i - 1];
        FT_Long      sub_upm = (FT_Long)sub->font_dict.units_per_em;
        FT_Pos       x_scale, y_scale;


        if ( top_upm != sub_upm )
        {
          x_scale = FT_MulDiv( size->metrics.x_scale, top_upm, sub_upm );
          y_scale = FT_MulDiv( size->metrics.y_scale, top_upm, sub_upm );
        }
        else
        {
          x_scale = size->metrics.x_scale;
          y_scale = size->metrics.y_scale;
        }

        funcs->set_scale( internal->subfonts[i - 1],
                          x_scale, y_scale, 0, 0 );
      }
    }

    return FT_Err_Ok;
  }